

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O1

void init_sound(void)

{
  char *pcVar1;
  char cVar2;
  char cVar9;
  short sVar17;
  ushort uVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar32 [16];
  ALLEGRO_SAMPLE_INSTANCE *pAVar33;
  char cVar34;
  uint uVar35;
  undefined1 *puVar36;
  long lVar37;
  undefined8 uVar38;
  int *piVar39;
  int iVar40;
  long lVar41;
  float fVar42;
  float fVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  float fVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  float fVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar64 [16];
  short sVar65;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  short sVar73;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  undefined4 uVar66;
  undefined6 uVar67;
  undefined1 auVar68 [12];
  undefined1 auVar69 [14];
  undefined1 auVar71 [16];
  undefined4 uVar74;
  undefined6 uVar75;
  undefined8 uVar76;
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar81 [16];
  
  cVar34 = al_is_audio_installed();
  if (cVar34 != '\0') {
    iVar40 = 0x2000;
    zap = create_sample_u8(0x5622,0x2000);
    puVar36 = (undefined1 *)al_get_sample_data(zap);
    fVar43 = 0.025;
    fVar42 = 0.02;
    fVar59 = 0.0;
    fVar54 = 0.0;
    do {
      dVar44 = fmod((double)fVar54,1.0);
      dVar45 = fmod((double)fVar59,1.0);
      *puVar36 = (char)(int)((double)((float)iVar40 * 0.00012207031 * 127.0) *
                             (dVar45 + dVar44 + -1.0) + 128.0);
      fVar59 = fVar59 + fVar43;
      fVar54 = fVar54 + fVar42;
      fVar43 = fVar43 + -1.25e-06;
      fVar42 = fVar42 + -1e-06;
      puVar36 = puVar36 + 1;
      iVar40 = iVar40 + -1;
    } while (iVar40 != 0);
    iVar40 = 0x2000;
    bang = create_sample_u8(0x5622,0x2000);
    puVar36 = (undefined1 *)al_get_sample_data(bang);
    fVar43 = 0.0;
    do {
      uVar35 = rand();
      fVar43 = fVar43 * 0.75 + ((float)(uVar35 & 0xff) / 255.0 + -0.5) * 0.25;
      *puVar36 = (char)(int)((float)iVar40 * 0.00012207031 * 255.0 * fVar43 + 128.0);
      puVar36 = puVar36 + 1;
      iVar40 = iVar40 + -1;
    } while (iVar40 != 0);
    iVar40 = 0x6000;
    bigbang = create_sample_u8(0x2b11,0x6000);
    lVar37 = al_get_sample_data(bigbang);
    fVar42 = 0.0;
    fVar59 = 0.0;
    fVar43 = 0.0;
    lVar41 = 0;
    do {
      fVar54 = ((float)(int)lVar41 / 24576.0) * 0.4 + 0.5;
      uVar35 = rand();
      fVar43 = (1.0 - fVar54) * ((float)(uVar35 & 0xff) / 255.0 + -0.5) + fVar43 * fVar54;
      dVar44 = sin((double)fVar59);
      dVar45 = sin((double)fVar42);
      *(char *)(lVar37 + lVar41) =
           (char)(int)((double)(((float)iVar40 / 24576.0) * 128.0) *
                       ((dVar45 + dVar44) * 0.25 + (double)fVar43) + 128.0);
      fVar42 = (float)((double)fVar42 + 0.04);
      fVar59 = (float)((double)fVar59 + 0.03);
      lVar41 = lVar41 + 1;
      iVar40 = iVar40 + -1;
    } while (iVar40 != 0);
    iVar40 = 0x2000;
    ping = create_sample_u8(0x5622,0x2000);
    puVar36 = (undefined1 *)al_get_sample_data(ping);
    fVar43 = 0.0;
    fVar42 = 0.0;
    do {
      dVar44 = sin((double)fVar42);
      dVar45 = sin((double)fVar43);
      *puVar36 = (char)(int)((double)((float)iVar40 * 0.00012207031 * 31.0) *
                             (dVar45 + dVar44 + -1.0) + 128.0);
      fVar43 = (float)((double)fVar43 + 0.3);
      fVar42 = (float)((double)fVar42 + 0.2);
      puVar36 = puVar36 + 1;
      iVar40 = iVar40 + -1;
    } while (iVar40 != 0);
    ping_timer = (ALLEGRO_TIMER *)al_create_timer(0x3fd3333333333333);
    if (no_music == 0) {
      cVar34 = al_is_audio_installed();
      if (cVar34 != '\0') {
        sine = create_sample_u8(0x5622,0x40);
        lVar37 = al_get_sample_data(sine);
        dVar44 = 0.0;
        lVar41 = 0;
        do {
          dVar45 = sin(dVar44 * 3.141592653589793 * 0.03125);
          dVar46 = sin((dVar44 * 3.141592653589793) / 12.0);
          *(char *)(lVar37 + lVar41) = (char)(int)((dVar46 + dVar45) * 8.0 + 128.0);
          dVar44 = dVar44 + 1.0;
          lVar41 = lVar41 + 1;
        } while ((int)lVar41 != 0x40);
        square = create_sample_u8(0x5622,0x40);
        lVar37 = al_get_sample_data(square);
        auVar32 = _DAT_0010c920;
        uVar35 = 0xc;
        uVar47 = 0xd;
        uVar48 = 0xe;
        uVar49 = 0xf;
        uVar50 = 8;
        uVar51 = 9;
        uVar52 = 10;
        uVar53 = 0xb;
        uVar55 = 4;
        uVar56 = 5;
        uVar57 = 6;
        uVar58 = 7;
        uVar60 = 0;
        uVar61 = 1;
        uVar62 = 2;
        uVar63 = 3;
        lVar41 = 0;
        do {
          auVar79._0_4_ = -(uint)((int)(uVar60 ^ 0x80000000) < -0x7fffffe0);
          auVar79._4_4_ = -(uint)((int)(uVar61 ^ 0x80000000) < -0x7fffffe0);
          auVar79._8_4_ = -(uint)((int)(uVar62 ^ 0x80000000) < -0x7fffffe0);
          auVar79._12_4_ = -(uint)((int)(uVar63 ^ 0x80000000) < -0x7fffffe0);
          auVar83._0_4_ = -(uint)((int)(uVar55 ^ 0x80000000) < -0x7fffffe0);
          auVar83._4_4_ = -(uint)((int)(uVar56 ^ 0x80000000) < -0x7fffffe0);
          auVar83._8_4_ = -(uint)((int)(uVar57 ^ 0x80000000) < -0x7fffffe0);
          auVar83._12_4_ = -(uint)((int)(uVar58 ^ 0x80000000) < -0x7fffffe0);
          auVar79 = packssdw(auVar79,auVar83);
          auVar82._0_4_ = -(uint)((int)(uVar50 ^ 0x80000000) < -0x7fffffe0);
          auVar82._4_4_ = -(uint)((int)(uVar51 ^ 0x80000000) < -0x7fffffe0);
          auVar82._8_4_ = -(uint)((int)(uVar52 ^ 0x80000000) < -0x7fffffe0);
          auVar82._12_4_ = -(uint)((int)(uVar53 ^ 0x80000000) < -0x7fffffe0);
          auVar84._0_4_ = -(uint)((int)(uVar35 ^ 0x80000000) < -0x7fffffe0);
          auVar84._4_4_ = -(uint)((int)(uVar47 ^ 0x80000000) < -0x7fffffe0);
          auVar84._8_4_ = -(uint)((int)(uVar48 ^ 0x80000000) < -0x7fffffe0);
          auVar84._12_4_ = -(uint)((int)(uVar49 ^ 0x80000000) < -0x7fffffe0);
          auVar83 = packssdw(auVar82,auVar84);
          auVar79 = packsswb(auVar79,auVar83);
          *(undefined1 (*) [16])(lVar37 + lVar41) = auVar79 & _DAT_0010c930 | ~auVar79 & auVar32;
          lVar41 = lVar41 + 0x10;
          uVar60 = uVar60 + 0x10;
          uVar61 = uVar61 + 0x10;
          uVar62 = uVar62 + 0x10;
          uVar63 = uVar63 + 0x10;
          uVar55 = uVar55 + 0x10;
          uVar56 = uVar56 + 0x10;
          uVar57 = uVar57 + 0x10;
          uVar58 = uVar58 + 0x10;
          uVar50 = uVar50 + 0x10;
          uVar51 = uVar51 + 0x10;
          uVar52 = uVar52 + 0x10;
          uVar53 = uVar53 + 0x10;
          uVar35 = uVar35 + 0x10;
          uVar47 = uVar47 + 0x10;
          uVar48 = uVar48 + 0x10;
          uVar49 = uVar49 + 0x10;
        } while (lVar41 != 0x40);
        saw = create_sample_u8(0x5622,0x40);
        lVar37 = al_get_sample_data(saw);
        auVar32 = _DAT_0010c950;
        uVar35 = 0xc;
        uVar47 = 0xd;
        uVar48 = 0xe;
        uVar49 = 0xf;
        uVar50 = 8;
        uVar51 = 9;
        uVar52 = 10;
        uVar53 = 0xb;
        uVar55 = 4;
        uVar56 = 5;
        uVar57 = 6;
        uVar58 = 7;
        uVar60 = 0;
        uVar61 = 1;
        uVar62 = 2;
        uVar63 = 3;
        lVar41 = 0;
        do {
          auVar64._0_4_ = uVar35 >> 2;
          auVar64._4_4_ = uVar47 >> 2;
          auVar64._8_4_ = uVar48 >> 2;
          auVar64._12_4_ = uVar49 >> 2;
          auVar70._0_4_ = uVar50 >> 2;
          auVar70._4_4_ = uVar51 >> 2;
          auVar70._8_4_ = uVar52 >> 2;
          auVar70._12_4_ = uVar53 >> 2;
          auVar72._0_4_ = uVar55 >> 2;
          auVar72._4_4_ = uVar56 >> 2;
          auVar72._8_4_ = uVar57 >> 2;
          auVar72._12_4_ = uVar58 >> 2;
          auVar80._0_4_ = uVar60 >> 2;
          auVar80._4_4_ = uVar61 >> 2;
          auVar80._8_4_ = uVar62 >> 2;
          auVar80._12_4_ = uVar63 >> 2;
          auVar80 = auVar80 & auVar32;
          auVar72 = auVar72 & auVar32;
          sVar17 = auVar80._0_2_;
          cVar2 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[0] - (0xff < sVar17);
          uVar18 = auVar80._2_2_;
          sVar73 = CONCAT11((uVar18 != 0) * (uVar18 < 0x100) * auVar80[2] - (0xff < uVar18),cVar2);
          sVar17 = auVar80._4_2_;
          cVar34 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[4] - (0xff < sVar17);
          uVar18 = auVar80._6_2_;
          uVar74 = CONCAT13((uVar18 != 0) * (uVar18 < 0x100) * auVar80[6] - (0xff < uVar18),
                            CONCAT12(cVar34,sVar73));
          sVar17 = auVar80._8_2_;
          cVar3 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[8] - (0xff < sVar17);
          sVar17 = auVar80._10_2_;
          uVar75 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar80[10] - (0xff < sVar17),
                            CONCAT14(cVar3,uVar74));
          sVar17 = auVar80._12_2_;
          cVar4 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[0xc] - (0xff < sVar17);
          sVar17 = auVar80._14_2_;
          uVar76 = CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar80[0xe] - (0xff < sVar17),
                            CONCAT16(cVar4,uVar75));
          sVar17 = auVar72._0_2_;
          cVar5 = (0 < sVar17) * (sVar17 < 0x100) * auVar72[0] - (0xff < sVar17);
          uVar18 = auVar72._2_2_;
          auVar77._0_10_ =
               CONCAT19((uVar18 != 0) * (uVar18 < 0x100) * auVar72[2] - (0xff < uVar18),
                        CONCAT18(cVar5,uVar76));
          sVar17 = auVar72._4_2_;
          cVar6 = (0 < sVar17) * (sVar17 < 0x100) * auVar72[4] - (0xff < sVar17);
          auVar77[10] = cVar6;
          uVar18 = auVar72._6_2_;
          auVar77[0xb] = (uVar18 != 0) * (uVar18 < 0x100) * auVar72[6] - (0xff < uVar18);
          sVar17 = auVar72._8_2_;
          cVar7 = (0 < sVar17) * (sVar17 < 0x100) * auVar72[8] - (0xff < sVar17);
          auVar78[0xc] = cVar7;
          auVar78._0_12_ = auVar77;
          sVar17 = auVar72._10_2_;
          auVar78[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar72[10] - (0xff < sVar17);
          sVar17 = auVar72._12_2_;
          cVar8 = (0 < sVar17) * (sVar17 < 0x100) * auVar72[0xc] - (0xff < sVar17);
          auVar81[0xe] = cVar8;
          auVar81._0_14_ = auVar78;
          sVar17 = auVar72._14_2_;
          auVar81[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar72[0xe] - (0xff < sVar17);
          auVar70 = auVar70 & auVar32;
          auVar64 = auVar64 & auVar32;
          sVar17 = auVar70._0_2_;
          cVar9 = (0 < sVar17) * (sVar17 < 0x100) * auVar70[0] - (0xff < sVar17);
          uVar18 = auVar70._2_2_;
          sVar65 = CONCAT11((uVar18 != 0) * (uVar18 < 0x100) * auVar70[2] - (0xff < uVar18),cVar9);
          sVar17 = auVar70._4_2_;
          cVar10 = (0 < sVar17) * (sVar17 < 0x100) * auVar70[4] - (0xff < sVar17);
          uVar18 = auVar70._6_2_;
          uVar66 = CONCAT13((uVar18 != 0) * (uVar18 < 0x100) * auVar70[6] - (0xff < uVar18),
                            CONCAT12(cVar10,sVar65));
          sVar17 = auVar70._8_2_;
          cVar11 = (0 < sVar17) * (sVar17 < 0x100) * auVar70[8] - (0xff < sVar17);
          sVar17 = auVar70._10_2_;
          uVar67 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar70[10] - (0xff < sVar17),
                            CONCAT14(cVar11,uVar66));
          sVar17 = auVar70._12_2_;
          cVar12 = (0 < sVar17) * (sVar17 < 0x100) * auVar70[0xc] - (0xff < sVar17);
          sVar17 = auVar70._14_2_;
          uVar38 = CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar70[0xe] - (0xff < sVar17),
                            CONCAT16(cVar12,uVar67));
          sVar17 = auVar64._0_2_;
          cVar13 = (0 < sVar17) * (sVar17 < 0x100) * auVar64[0] - (0xff < sVar17);
          uVar18 = auVar64._2_2_;
          auVar68._0_10_ =
               CONCAT19((uVar18 != 0) * (uVar18 < 0x100) * auVar64[2] - (0xff < uVar18),
                        CONCAT18(cVar13,uVar38));
          sVar17 = auVar64._4_2_;
          cVar14 = (0 < sVar17) * (sVar17 < 0x100) * auVar64[4] - (0xff < sVar17);
          auVar68[10] = cVar14;
          uVar18 = auVar64._6_2_;
          auVar68[0xb] = (uVar18 != 0) * (uVar18 < 0x100) * auVar64[6] - (0xff < uVar18);
          sVar17 = auVar64._8_2_;
          cVar15 = (0 < sVar17) * (sVar17 < 0x100) * auVar64[8] - (0xff < sVar17);
          auVar69[0xc] = cVar15;
          auVar69._0_12_ = auVar68;
          sVar17 = auVar64._10_2_;
          auVar69[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar64[10] - (0xff < sVar17);
          sVar17 = auVar64._12_2_;
          cVar16 = (0 < sVar17) * (sVar17 < 0x100) * auVar64[0xc] - (0xff < sVar17);
          auVar71[0xe] = cVar16;
          auVar71._0_14_ = auVar69;
          sVar17 = auVar64._14_2_;
          auVar71[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar64[0xe] - (0xff < sVar17);
          sVar17 = (short)((uint)uVar74 >> 0x10);
          sVar19 = (short)((uint6)uVar75 >> 0x20);
          sVar20 = (short)((ulong)uVar76 >> 0x30);
          sVar21 = (short)((unkuint10)auVar77._0_10_ >> 0x40);
          sVar22 = auVar77._10_2_;
          sVar23 = auVar78._12_2_;
          sVar24 = auVar81._14_2_;
          sVar25 = (short)((uint)uVar66 >> 0x10);
          sVar26 = (short)((uint6)uVar67 >> 0x20);
          sVar27 = (short)((ulong)uVar38 >> 0x30);
          sVar28 = (short)((unkuint10)auVar68._0_10_ >> 0x40);
          sVar29 = auVar68._10_2_;
          sVar30 = auVar69._12_2_;
          sVar31 = auVar71._14_2_;
          pcVar1 = (char *)(lVar37 + lVar41);
          *pcVar1 = ((0 < sVar73) * (sVar73 < 0x100) * cVar2 - (0xff < sVar73)) + 'x';
          pcVar1[1] = ((0 < sVar17) * (sVar17 < 0x100) * cVar34 - (0xff < sVar17)) + 'x';
          pcVar1[2] = ((0 < sVar19) * (sVar19 < 0x100) * cVar3 - (0xff < sVar19)) + 'x';
          pcVar1[3] = ((0 < sVar20) * (sVar20 < 0x100) * cVar4 - (0xff < sVar20)) + 'x';
          pcVar1[4] = ((0 < sVar21) * (sVar21 < 0x100) * cVar5 - (0xff < sVar21)) + 'x';
          pcVar1[5] = ((0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22)) + 'x';
          pcVar1[6] = ((0 < sVar23) * (sVar23 < 0x100) * cVar7 - (0xff < sVar23)) + 'x';
          pcVar1[7] = ((0 < sVar24) * (sVar24 < 0x100) * cVar8 - (0xff < sVar24)) + 'x';
          pcVar1[8] = ((0 < sVar65) * (sVar65 < 0x100) * cVar9 - (0xff < sVar65)) + 'x';
          pcVar1[9] = ((0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25)) + 'x';
          pcVar1[10] = ((0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26)) + 'x';
          pcVar1[0xb] = ((0 < sVar27) * (sVar27 < 0x100) * cVar12 - (0xff < sVar27)) + 'x';
          pcVar1[0xc] = ((0 < sVar28) * (sVar28 < 0x100) * cVar13 - (0xff < sVar28)) + 'x';
          pcVar1[0xd] = ((0 < sVar29) * (sVar29 < 0x100) * cVar14 - (0xff < sVar29)) + 'x';
          pcVar1[0xe] = ((0 < sVar30) * (sVar30 < 0x100) * cVar15 - (0xff < sVar30)) + 'x';
          pcVar1[0xf] = ((0 < sVar31) * (sVar31 < 0x100) * cVar16 - (0xff < sVar31)) + 'x';
          lVar41 = lVar41 + 0x10;
          uVar60 = uVar60 + 0x10;
          uVar61 = uVar61 + 0x10;
          uVar62 = uVar62 + 0x10;
          uVar63 = uVar63 + 0x10;
          uVar55 = uVar55 + 0x10;
          uVar56 = uVar56 + 0x10;
          uVar57 = uVar57 + 0x10;
          uVar58 = uVar58 + 0x10;
          uVar50 = uVar50 + 0x10;
          uVar51 = uVar51 + 0x10;
          uVar52 = uVar52 + 0x10;
          uVar53 = uVar53 + 0x10;
          uVar35 = uVar35 + 0x10;
          uVar47 = uVar47 + 0x10;
          uVar48 = uVar48 + 0x10;
          uVar49 = uVar49 + 0x10;
        } while (lVar41 != 0x40);
        iVar40 = 0x400;
        bd = create_sample_u8(0x5622,0x400);
        puVar36 = (undefined1 *)al_get_sample_data(bd);
        dVar44 = 0.0;
        do {
          dVar45 = sin(dVar44 / 48.0);
          dVar46 = sin(dVar44 * 0.03125);
          *puVar36 = (char)(int)((double)((float)iVar40 * 0.0625) * (dVar46 + dVar45) + 128.0);
          puVar36 = puVar36 + 1;
          dVar44 = dVar44 + 1.0;
          iVar40 = iVar40 + -1;
        } while (iVar40 != 0);
        iVar40 = 0xc00;
        snare = create_sample_u8(0x5622,0xc00);
        puVar36 = (undefined1 *)al_get_sample_data(snare);
        fVar43 = 0.0;
        do {
          uVar35 = rand();
          fVar43 = fVar43 * 0.9 + ((float)(uVar35 & 0xff) / 255.0 + -0.5) * 0.1;
          *puVar36 = (char)(int)(((float)iVar40 / 24.0) * fVar43 + 128.0);
          puVar36 = puVar36 + 1;
          iVar40 = iVar40 + -1;
        } while (iVar40 != 0);
        iVar40 = 0x400;
        hihat = create_sample_u8(0x5622,0x400);
        puVar36 = (undefined1 *)al_get_sample_data(hihat);
        dVar44 = 0.0;
        do {
          dVar45 = sin(dVar44 / 4.2);
          uVar35 = rand();
          *puVar36 = (char)(int)((double)((float)iVar40 / 192.0) *
                                 ((double)(uVar35 & 0xff) / 255.0 + -0.5 + dVar45) + 128.0);
          puVar36 = puVar36 + 1;
          dVar44 = dVar44 + 1.0;
          iVar40 = iVar40 + -1;
        } while (iVar40 != 0);
        piVar39 = freq_table;
        lVar37 = 0;
        do {
          dVar44 = exp2((double)(int)lVar37 / 12.0);
          *piVar39 = (int)(dVar44 * 350.0);
          lVar37 = lVar37 + 1;
          piVar39 = piVar39 + 1;
        } while (lVar37 != 0x100);
        part_time[0] = 0;
        part_time[1] = 0;
        part_time[2] = 0;
        part_time[3] = 0;
        part_pos[0] = part_1;
        part_pos[1] = part_2;
        part_pos[2] = part_3;
        part_pos[3] = part_4;
        part_voice[0] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(sine);
        part_voice[1] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(square);
        part_voice[2] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(saw);
        part_voice[3] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(bd);
        pAVar33 = part_voice[0];
        uVar38 = al_get_default_mixer();
        al_attach_sample_instance_to_mixer(pAVar33,uVar38);
        pAVar33 = part_voice[1];
        uVar38 = al_get_default_mixer();
        al_attach_sample_instance_to_mixer(pAVar33,uVar38);
        pAVar33 = part_voice[2];
        uVar38 = al_get_default_mixer();
        al_attach_sample_instance_to_mixer(pAVar33,uVar38);
        pAVar33 = part_voice[3];
        uVar38 = al_get_default_mixer();
        al_attach_sample_instance_to_mixer(pAVar33,uVar38);
        al_set_sample_instance_playmode(part_voice[0],0x101);
        al_set_sample_instance_playmode(part_voice[1],0x101);
        al_set_sample_instance_playmode(part_voice[2],0x101);
        al_set_sample_instance_playmode(part_voice[3],0x100);
        al_set_sample_instance_gain(part_voice[0]);
        al_set_sample_instance_gain(part_voice[1]);
        al_set_sample_instance_gain(part_voice[2]);
        al_set_sample_instance_gain(part_voice[3]);
        al_set_sample_instance_pan(part_voice[0]);
        al_set_sample_instance_pan(part_voice[1]);
        al_set_sample_instance_pan(part_voice[2]);
        al_set_sample_instance_pan(part_voice[3]);
        music_timer = (ALLEGRO_TIMER *)al_create_timer(0x3fa745d1745d1746);
      }
      al_start_timer(music_timer);
    }
    sound_update_thread = (ALLEGRO_THREAD *)al_create_thread(sound_update_proc,0);
    al_start_thread(sound_update_thread);
    return;
  }
  return;
}

Assistant:

void init_sound()
{
   float f, osc1, osc2, freq1, freq2, vol, val;
   char *p;
   int len;
   int i;

   if (!al_is_audio_installed())
      return;

   /* zap (firing sound) consists of multiple falling saw waves */
   len = 8192;
   zap = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(zap);

   osc1 = 0;
   freq1 = 0.02;

   osc2 = 0;
   freq2 = 0.025;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 127;

      *p = 128 + (fmod(osc1, 1) + fmod(osc2, 1) - 1) * vol;

      osc1 += freq1;
      freq1 -= 0.000001;

      osc2 += freq2;
      freq2 -= 0.00000125;

      p++;
   }

   /* bang (explosion) consists of filtered noise */
   len = 8192;
   bang = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(bang);

   val = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 255;
      val = (val * 0.75) + (RAND * 0.25);
      *p = 128 + val * vol;
      p++;
   }

   /* big bang (explosion) consists of noise plus rumble */
   len = 24576;
   bigbang = create_sample_u8(11025, len);

   p = (char *)al_get_sample_data(bigbang);

   val = 0;

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 128;

      f = 0.5 + ((float)i / (float)len * 0.4);
      val = (val * f) + (RAND * (1-f));

      *p = 128 + (val + (sin(osc1) + sin(osc2)) / 4) * vol;

      osc1 += 0.03;
      osc2 += 0.04;

      p++;
   }

   /* ping consists of two sine waves */
   len = 8192;
   ping = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(ping);

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 31;

      *p = 128 + (sin(osc1) + sin(osc2) - 1) * vol;

      osc1 += 0.2;
      osc2 += 0.3;

      p++;
   }

   ping_timer = al_create_timer(0.3);

   /* set up my lurvely music player :-) */
   if (!no_music) {
      init_music();
      al_start_timer(music_timer);
   }

   sound_update_thread = al_create_thread(sound_update_proc, NULL);
   al_start_thread(sound_update_thread);
}